

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest::~TextSerializerTest(TextSerializerTest *this)

{
  pointer pBVar1;
  pointer pQVar2;
  pointer pcVar3;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TextSerializerTest_001b4398;
  pBVar1 = (this->metric).histogram.bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1);
  }
  pQVar2 = (this->metric).summary.quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pQVar2 != (pointer)0x0) {
    operator_delete(pQVar2);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&(this->metric).label);
  pcVar3 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->name).field_2) {
    operator_delete(pcVar3);
  }
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

std::string Serialize(MetricType type) const {
    MetricFamily metricFamily;
    metricFamily.name = name;
    metricFamily.help = "my metric help text";
    metricFamily.type = type;
    metricFamily.metric = std::vector<ClientMetric>{metric};

    std::vector<MetricFamily> families{metricFamily};

    return textSerializer.Serialize(families);
  }